

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack10_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3ff) + base;
  out[1] = (*in >> 10 & 0x3ff) + base;
  out[2] = (*in >> 0x14 & 0x3ff) + base;
  uVar1 = *in;
  out[3] = uVar1 >> 0x1e;
  out[3] = (uVar1 >> 0x1e) + base + (in[1] & 0xff) * 4;
  out[4] = (in[1] >> 8 & 0x3ff) + base;
  out[5] = (in[1] >> 0x12 & 0x3ff) + base;
  uVar1 = in[1];
  out[6] = uVar1 >> 0x1c;
  out[6] = (uVar1 >> 0x1c) + base + (in[2] & 0x3f) * 0x10;
  out[7] = (in[2] >> 6 & 0x3ff) + base;
  return in + 3;
}

Assistant:

uint32_t * unpack10_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 10 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 10 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 10 )  ;
    *out += base;
    out++;

    return in + 1;
}